

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall
wasm_tabletype_t::wasm_tabletype_t
          (wasm_tabletype_t *this,wasm_valtype_t *type,wasm_limits_t *limits)

{
  ExternType *local_40;
  undefined1 local_38 [16];
  undefined2 local_28;
  
  local_38._8_4_ = (*limits).max;
  local_38._0_8_ = (ulong)*limits & 0xffffffff;
  local_38._12_4_ = 0;
  local_28._0_1_ = true;
  local_28._1_1_ = false;
  wabt::MakeUnique<wabt::interp::TableType,wabt::Type&,wabt::Limits>
            ((wabt *)&local_40,&type->I,(Limits *)local_38);
  (this->super_wasm_externtype_t).I._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl = local_40;
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_externtype_t_001f0c88;
  (this->elemtype).I.enum_ = (type->I).enum_;
  this->limits = *limits;
  wasm_valtype_delete(type);
  return;
}

Assistant:

wasm_tabletype_t(own wasm_valtype_t* type, const wasm_limits_t* limits)
      : wasm_externtype_t{MakeUnique<TableType>(type->I,
                                                ToWabtLimits(*limits))},
        elemtype(*type),
        limits(*limits) {
    wasm_valtype_delete(type);
  }